

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::MultiNode<int,_QString>_>::erase
          (Span<QHashPrivate::MultiNode<int,_QString>_> *this,size_t bucket)

{
  byte bVar1;
  MultiNodeChain<QString> *this_00;
  Entry *pEVar2;
  
  bVar1 = this->offsets[bucket];
  this->offsets[bucket] = 0xff;
  pEVar2 = this->entries;
  this_00 = *(MultiNodeChain<QString> **)(pEVar2[bVar1].storage.data + 8);
  if (this_00 != (MultiNodeChain<QString> *)0x0) {
    MultiNodeChain<QString>::free(this_00,(void *)bucket);
    pEVar2 = this->entries;
  }
  pEVar2[bVar1].storage.data[0] = this->nextFree;
  this->nextFree = bVar1;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }